

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O0

void ft_conic_split(PVG_FT_Vector *base)

{
  long lVar1;
  long lVar2;
  PVG_FT_Pos b;
  PVG_FT_Pos a;
  PVG_FT_Vector *base_local;
  
  base[4].x = base[2].x;
  lVar1 = base->x + base[1].x;
  lVar2 = base[1].x + base[2].x;
  base[3].x = lVar2 >> 1;
  base[2].x = lVar1 + lVar2 >> 2;
  base[1].x = lVar1 >> 1;
  base[4].y = base[2].y;
  lVar1 = base->y + base[1].y;
  lVar2 = base[1].y + base[2].y;
  base[3].y = lVar2 >> 1;
  base[2].y = lVar1 + lVar2 >> 2;
  base[1].y = lVar1 >> 1;
  return;
}

Assistant:

static void ft_conic_split(PVG_FT_Vector* base)
{
    PVG_FT_Pos a, b;

    base[4].x = base[2].x;
    a = base[0].x + base[1].x;
    b = base[1].x + base[2].x;
    base[3].x = b >> 1;
    base[2].x = ( a + b ) >> 2;
    base[1].x = a >> 1;

    base[4].y = base[2].y;
    a = base[0].y + base[1].y;
    b = base[1].y + base[2].y;
    base[3].y = b >> 1;
    base[2].y = ( a + b ) >> 2;
    base[1].y = a >> 1;
}